

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzadmchunk.h
# Opt level: O3

void __thiscall
TPZAdmChunkVector<TPZGraphNode,_10>::Write
          (TPZAdmChunkVector<TPZGraphNode,_10> *this,TPZStream *buf,int withclassid)

{
  TPZGraphNode *pTVar1;
  ulong nelem;
  uint64_t nc;
  int val;
  ulong local_30;
  CompactScheme local_24;
  
  local_30 = (this->super_TPZChunkVector<TPZGraphNode,_10>).fNElements;
  (*buf->_vptr_TPZStream[6])(buf,&local_30,1);
  if (local_30 != 0) {
    nelem = 0;
    do {
      pTVar1 = TPZChunkVector<TPZGraphNode,_10>::operator[]
                         (&this->super_TPZChunkVector<TPZGraphNode,_10>,nelem);
      (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[5])(pTVar1,buf,(ulong)(uint)withclassid);
      nelem = nelem + 1;
    } while (nelem < local_30);
  }
  local_24 = this->fCompactScheme;
  (*buf->_vptr_TPZStream[3])(buf,&local_24,1);
  TPZStream::Write<int>(buf,(TPZVec<int> *)&this->fFree);
  TPZStream::Write<int>(buf,&(this->fNFree).super_TPZVec<int>);
  return;
}

Assistant:

void Write(TPZStream& buf, int withclassid) const override{
        uint64_t c, nc = this->NElements();
        buf.Write(&nc);
        for (c = 0; c < nc; c++){
            WriteInternal(this->operator [](c), buf, withclassid);
        }
        int val = as_integer( this->fCompactScheme );
        buf.Write(&val);
        buf.Write(this->fFree);
        buf.Write(this->fNFree);
    }